

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O1

ztresult_t savehandler_uint(char *name,ztuint_t *pvalue,size_t nelems,size_t stride,void *opaque)

{
  ulong uVar1;
  uint uVar2;
  char *fmt;
  size_t sVar3;
  ulong uVar4;
  
  if (nelems == 1) {
    emitf((savestate_t *)opaque,"%s = $%X;\n",name,(ulong)*pvalue);
  }
  else {
    emitf((savestate_t *)opaque,"%s = [\n",name);
    *(int *)((long)opaque + 0xc) = *(int *)((long)opaque + 0xc) + 1;
    if (nelems != 0) {
      uVar4 = 0;
      do {
        uVar1 = uVar4 + stride;
        sVar3 = stride;
        if (uVar4 < uVar1) {
          do {
            fmt = "$%X";
            if (uVar4 < nelems - 1) {
              fmt = "$%X, ";
            }
            uVar2 = *pvalue;
            pvalue = pvalue + 1;
            emitf((savestate_t *)opaque,fmt,(ulong)uVar2);
            uVar4 = uVar4 + 1;
            sVar3 = sVar3 - 1;
          } while (sVar3 != 0);
        }
        emitf((savestate_t *)opaque,"\n");
        uVar4 = uVar1;
      } while (uVar1 < nelems);
    }
    *(int *)((long)opaque + 0xc) = *(int *)((long)opaque + 0xc) + -1;
    emitf((savestate_t *)opaque,"];\n");
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_uint(const char     *name,
                                   const ztuint_t *pvalue,
                                   size_t          nelems,
                                   size_t          stride,
                                   void           *opaque)
{
  savestate_t *state = opaque;
  DUMP(word_t);
  return ztresult_OK;
}